

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_list.c
# Opt level: O0

void test_element_macros(void)

{
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  list_element *e;
  
  cunit_start_test("test_element_macros");
  head.prev = &head;
  head.next = &head;
  add_elements(elements1,false);
  cunit_named_check(head.next == &elements1[0].node,"test_element_macros",0xfd,"list_first_element")
  ;
  cunit_named_check(head.prev == &elements1[5].node,"test_element_macros",0xfe,"list_first_element")
  ;
  cunit_named_check(elements1[0].node.next == &elements1[1].node,"test_element_macros",0x100,
                    "list_next_element(elements1[0])");
  cunit_named_check(elements1[1].node.prev == &elements1[0].node,"test_element_macros",0x101,
                    "list_prev_element(elements1[1])");
  cunit_end_test("test_element_macros");
  return;
}

Assistant:

static void test_element_macros(void) {
  struct list_element *e;

  START_TEST();
  list_init_head(&head);
  add_elements(elements1, false);

  CHECK_TRUE(list_first_element(&head, e, node) == &elements1[0], "list_first_element");
  CHECK_TRUE(list_last_element(&head, e, node) == &elements1[COUNT-1], "list_first_element");

  CHECK_TRUE(list_next_element(&elements1[0], node) == &elements1[1], "list_next_element(elements1[0])");
  CHECK_TRUE(list_prev_element(&elements1[1], node) == &elements1[0], "list_prev_element(elements1[1])");
  END_TEST();
}